

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Bezier.cpp
# Opt level: O3

int __thiscall Bezier::init(Bezier *this,EVP_PKEY_CTX *ctx)

{
  Vector3 *this_00;
  Polynomial *this_01;
  Polynomial *this_02;
  pointer pVVar1;
  pointer pdVar2;
  double dVar3;
  int iVar4;
  int extraout_EAX;
  int extraout_EAX_00;
  pointer A;
  ostream *poVar5;
  Vector3 *i;
  pointer pVVar6;
  float fVar7;
  float fVar8;
  double dVar9;
  pair<Polynomial,_Polynomial> tmp;
  Vector3 local_b8;
  float local_94;
  double local_90;
  pair<Polynomial,_Polynomial> local_88;
  Vector3 local_58;
  Vector3 local_38;
  
  puts("initializing Bezier");
  this_00 = &this->Dz;
  Vector3::normalized(this_00);
  (this->Dz).z = (double)local_88.first.c.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->Dz).x = (double)local_88.first.c.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
  (this->Dz).y = (double)local_88.first.c.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
  dVar9 = (this->Dz).x;
  if (((((dVar9 < -1e-05) || (1e-05 < dVar9)) || (dVar9 = (this->Dz).y + -1.0, dVar9 < -1e-05)) ||
      ((1e-05 < dVar9 || (dVar9 = (this->Dz).z, dVar9 < -1e-05)))) || (1e-05 < dVar9)) {
    local_58.x._0_4_ = 0;
    local_58.x._4_4_ = 0;
    local_58.y._0_4_ = 0;
    local_58.y._4_4_ = 0x3ff00000;
    local_58.z = 0.0;
    Vector3::cross(&local_58,this_00);
    Vector3::normalized(&local_b8);
    (this->Dx).z = (double)local_88.first.c.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage;
    (this->Dx).x = (double)local_88.first.c.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_start;
    (this->Dx).y = (double)local_88.first.c.super__Vector_base<double,_std::allocator<double>_>.
                           _M_impl.super__Vector_impl_data._M_finish;
  }
  else {
    (this->Dx).x = 1.0;
    (this->Dx).y = 0.0;
    (this->Dx).z = 0.0;
  }
  Vector3::cross(this_00,&this->Dx);
  (this->Dy).z = (double)local_88.first.c.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_end_of_storage;
  (this->Dy).x = (double)local_88.first.c.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_start;
  (this->Dy).y = (double)local_88.first.c.super__Vector_base<double,_std::allocator<double>_>.
                         _M_impl.super__Vector_impl_data._M_finish;
  A = (this->control_points).super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
      super__Vector_impl_data._M_start;
  pVVar1 = (this->control_points).super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
           super__Vector_impl_data._M_finish;
  pVVar6 = A;
  if (A != pVVar1) {
    do {
      operator/=(A,&this->S);
      A = A + 1;
    } while (A != pVVar1);
    A = (this->control_points).super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
        super__Vector_impl_data._M_finish;
    pVVar6 = (this->control_points).super__Vector_base<Vector3,_std::allocator<Vector3>_>._M_impl.
             super__Vector_impl_data._M_start;
  }
  P2d(&local_88,this,0,(int)((ulong)((long)A - (long)pVVar6) >> 3) * -0x55555555);
  this_01 = &this->px;
  std::vector<double,_std::allocator<double>_>::operator=
            (&this_01->c,(vector<double,_std::allocator<double>_> *)&local_88);
  this_02 = &this->py;
  std::vector<double,_std::allocator<double>_>::operator=(&this_02->c,&local_88.second.c);
  Polynomial::derivative((Polynomial *)&local_b8,this_01);
  pdVar2 = (this->dpx).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->dpx).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_b8.x;
  (this->dpx).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_b8.y;
  (this->dpx).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_b8.z;
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  local_b8.z = 0.0;
  if ((pdVar2 != (pointer)0x0) && (operator_delete(pdVar2), (pointer)local_b8.x != (pointer)0x0)) {
    operator_delete((void *)local_b8.x);
  }
  Polynomial::derivative((Polynomial *)&local_b8,this_02);
  pdVar2 = (this->dpy).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
           super__Vector_impl_data._M_start;
  (this->dpy).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)local_b8.x;
  (this->dpy).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)local_b8.y;
  (this->dpy).c.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)local_b8.z;
  local_b8.x = 0.0;
  local_b8.y = 0.0;
  local_b8.z = 0.0;
  if ((pdVar2 != (pointer)0x0) && (operator_delete(pdVar2), (void *)local_b8.x != (void *)0x0)) {
    operator_delete((void *)local_b8.x);
  }
  dVar9 = Polynomial::operator()(this_01,0.0);
  dVar3 = Polynomial::operator()(this_02,0.0);
  printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n",0,dVar9,dVar3);
  dVar9 = Polynomial::operator()(this_01,0.5);
  dVar3 = Polynomial::operator()(this_02,0.5);
  printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n",0,dVar9,dVar3);
  dVar9 = Polynomial::operator()(this_01,1.0);
  dVar3 = Polynomial::operator()(this_02,1.0);
  printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n",0,dVar9,dVar3);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cout,"Bezier points:\n",0xf);
  fVar7 = 0.0;
  do {
    local_90 = (double)fVar7;
    fVar8 = 0.0;
    local_94 = fVar7;
    do {
      getPoint(&local_38,this,local_90,(double)(fVar8 + fVar8) * ::PI);
      BoundingBox::include(&this->bbox,&local_38);
      fVar8 = fVar8 + 0.01;
    } while (fVar8 <= 1.0);
    fVar7 = local_94 + 0.01;
  } while (fVar7 <= 1.0);
  poVar5 = operator<<((ostream *)&std::cout,&this->bbox);
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar5 + -0x18) + (char)poVar5);
  std::ostream::put((char)poVar5);
  iVar4 = std::ostream::flush();
  if (local_88.second.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.second.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
    iVar4 = extraout_EAX;
  }
  if (local_88.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_88.first.c.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start);
    iVar4 = extraout_EAX_00;
  }
  return iVar4;
}

Assistant:

void Bezier::init()
{
    printf("initializing Bezier\n");
    Dz = Dz.normalized();
    if (!sign(Dz.x) && !sign(Dz.y - 1) && !sign(Dz.z)) Dx = Vector3(1, 0, 0);
    else Dx = Vector3(0, 1, 0).cross(Dz).normalized();
    Dy = Dz.cross(Dx);
    for (auto &i :control_points) i /= S;
    std::pair<Polynomial, Polynomial> tmp = P2d(0, control_points.size());
    px = tmp.first; py = tmp.second;
    dpx = px.derivative(); dpy = py.derivative();
    printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n", 0., px(0), py(0));
    printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n", 0.5, px(0.5), py(0.5));
    printf("Test for Bezier: P(%.3f)=(%.3f, %.3f)\n", 1., px(1), py(1));
    std::cout << "Bezier points:\n";
    for (float u = 0.0f, i = 0, du = 0.01; u <= 1.0f; u += du, i++) {
        for (float v = 0.0f, j = 0, dv = 0.01; v <= 1.0f; v += dv, j++) {
            bbox.include(getPoint(u, v * 2 * PI));
        }
    }
    std::cout << bbox << std::endl;
}